

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltalloc.cc
# Opt level: O0

void add_batch_to_central_cache(CentralCache *cc,uint sizeClass,FreeBlock *batch)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  ChunkSm *local_28;
  ChunkSm *cs;
  FreeBlock *batch_local;
  uint sizeClass_local;
  CentralCache *cc_local;
  
  uVar2 = get_size_class(0x10);
  if (sizeClass < uVar2) {
    local_28 = (cc->field_3).chunkWithFreeBatches;
    if (local_28->numBatches == 0x20) {
      local_28 = ((cc->field_3).chunkWithFreeBatches)->next;
      (cc->field_3).chunkWithFreeBatches = local_28;
      bVar3 = false;
      if (local_28 != (ChunkSm *)0x0) {
        bVar3 = local_28->numBatches == 0;
      }
      if (!bVar3) {
        __assert_fail("cs && cs->numBatches == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ktnr[P]TwoStepBranchingProcedure/external/ltalloc/ltalloc.cc"
                      ,0x3d8,
                      "void add_batch_to_central_cache(CentralCache *, unsigned int, FreeBlock *)");
      }
    }
    iVar1 = local_28->numBatches;
    local_28->numBatches = iVar1 + 1;
    local_28->batches[iVar1] = batch;
  }
  else {
    batch->nextBatch = (FreeBlock *)cc->field_3;
    (cc->field_3).firstBatch = batch;
  }
  return;
}

Assistant:

static void add_batch_to_central_cache(CentralCache* cc, unsigned int sizeClass, FreeBlock* batch)
{
	if (!CHUNK_IS_SMALL)
	{
		batch->nextBatch = cc->firstBatch;
		cc->firstBatch = batch;
	}
	else
	{
		ChunkSm* cs = cc->chunkWithFreeBatches;
		if (unlikely(cs->numBatches == NUM_OF_BATCHES_IN_CHUNK_SM))
		{
			cs = cc->chunkWithFreeBatches = cc->chunkWithFreeBatches->next;
			LTALLOC_ASSERT(cs && cs->numBatches == 0);
		}
		cs->batches[cs->numBatches++] = batch;
	}
}